

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::ReferenceContext::blendFunc(ReferenceContext *this,deUint32 src,deUint32 dst)

{
  bool bVar1;
  
  bVar1 = isValidBlendFactor(src);
  if ((bVar1) && (bVar1 = isValidBlendFactor(dst), bVar1)) {
    this->m_blendFactorSrcRGB = src;
    this->m_blendFactorSrcAlpha = src;
    this->m_blendFactorDstRGB = dst;
    this->m_blendFactorDstAlpha = dst;
    return;
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::blendFunc (deUint32 src, deUint32 dst)
{
	RC_IF_ERROR(!isValidBlendFactor(src) ||
				!isValidBlendFactor(dst),
				GL_INVALID_ENUM, RC_RET_VOID);

	m_blendFactorSrcRGB		= src;
	m_blendFactorSrcAlpha	= src;
	m_blendFactorDstRGB		= dst;
	m_blendFactorDstAlpha	= dst;
}